

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

int __thiscall bdQuery::addProxy(bdQuery *this,bdId *id,bdId *src,uint32_t srcmode)

{
  int iVar1;
  time_t tVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar3;
  list<bdPeer,_std::allocator<bdPeer>_> *this_00;
  bdMetric dist;
  bdPeer peer;
  
  iVar3 = 0;
  tVar2 = time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&id->id,&dist,in_R8,in_R9,tVar2);
  iVar1 = (*this->mFns->_vptr_bdDhtFunctions[6])(this->mFns,&dist);
  if ((src != (bdId *)0x0) && (iVar1 == 0)) {
    iVar1 = updateProxyList(this,src,srcmode,&this->mProxiesUnknown);
    if (iVar1 == 0) {
      iVar1 = updateProxyList(this,src,srcmode,&this->mProxiesFlagged);
      if (iVar1 == 0) {
        bdPeer::bdPeer(&peer);
        peer.mPeerId.id.data._16_4_ = *(undefined4 *)((src->id).data + 0x10);
        peer.mPeerId.addr.sin_family = (src->addr).sin_family;
        peer.mPeerId.addr.sin_port = (src->addr).sin_port;
        peer.mPeerId.addr.sin_addr.s_addr = (src->addr).sin_addr.s_addr;
        peer.mPeerId.addr.sin_zero = *&(src->addr).sin_zero;
        peer.mPeerId.id.data._0_8_ = *(undefined8 *)(src->id).data;
        peer.mPeerId.id.data._8_8_ = *(undefined8 *)((src->id).data + 8);
        peer.mLastSendTime = 0;
        this_00 = &this->mProxiesUnknown;
        if ((this->mRequiredPeerFlags & ~srcmode) == 0) {
          this_00 = &this->mProxiesFlagged;
        }
        peer.mPeerFlags = srcmode;
        peer.mLastRecvTime = tVar2;
        peer.mFoundTime = tVar2;
        std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::push_front(this_00,&peer);
      }
    }
    trimProxies(this);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int bdQuery::addProxy(const bdId *id, const bdId *src, uint32_t srcmode) {
	bdMetric dist;
	time_t now = time(NULL);
	
	mFns->bdDistance(&mId, &(id->id), &dist);
	
	/* finally if it is an exact match, add as potential proxy */
	int bucket = mFns->bdBucketDistance(&dist);
	if ((bucket != 0) || (src == NULL))
		/* not a potential proxy */
		return 0;

#ifdef DEBUG_QUERY 
	fprintf(stderr, "Bucket = 0, Have Potential Proxy!\n");
#endif

	bool found = false;
	if (updateProxyList(src, srcmode, mProxiesUnknown))
		found = true;

	if (!found)
		if (updateProxyList(src, srcmode, mProxiesFlagged))
			found = true;

	if (!found) {
		/* if we get here. its not in the list */
#ifdef DEBUG_QUERY 
		fprintf(stderr, "Adding Source to Proxy List:\n");
#endif
		bdPeer peer;
		peer.mPeerId = *src;
		peer.mPeerFlags = srcmode;
		peer.mLastSendTime = 0;
		peer.mLastRecvTime = now;
		peer.mFoundTime = now;
	
		/* add it in */
		if ((srcmode & mRequiredPeerFlags) == mRequiredPeerFlags)
			mProxiesFlagged.push_front(peer);
		else
			mProxiesUnknown.push_front(peer);
	}

	trimProxies();
	
	return 1;
}